

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::DataPageHeader::DataPageHeader(DataPageHeader *this)

{
  *(undefined ***)this = &PTR__DataPageHeader_017b5380;
  this->num_values = 0;
  this->encoding = PLAIN;
  this->definition_level_encoding = PLAIN;
  this->repetition_level_encoding = PLAIN;
  Statistics::Statistics(&this->statistics);
  this->__isset = (_DataPageHeader__isset)((byte)this->__isset & 0xfe);
  return;
}

Assistant:

DataPageHeader::DataPageHeader() noexcept
   : num_values(0),
     encoding(static_cast<Encoding::type>(0)),
     definition_level_encoding(static_cast<Encoding::type>(0)),
     repetition_level_encoding(static_cast<Encoding::type>(0)) {
}